

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

void __thiscall tcmalloc::PageHeap::GetLargeSpanStatsLocked(PageHeap *this,LargeSpanStats *result)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  p_Var1 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  lVar4 = 0;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    lVar2 = 0;
    do {
      lVar2 = (long)&(p_Var1[1]._M_parent)->_M_color + lVar2;
      result->normal_pages = lVar2;
      lVar4 = lVar4 + 1;
      result->spans = lVar4;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  p_Var1 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    lVar2 = 0;
    do {
      lVar4 = lVar4 + 1;
      lVar2 = (long)&(p_Var1[1]._M_parent)->_M_color + lVar2;
      result->returned_pages = lVar2;
      result->spans = lVar4;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  return;
}

Assistant:

void PageHeap::GetLargeSpanStatsLocked(LargeSpanStats* result) {
  ASSERT(lock_.IsHeld());
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  for (SpanSetIter it = large_normal_.begin(); it != large_normal_.end(); ++it) {
    result->normal_pages += it->length;
    result->spans++;
  }
  for (SpanSetIter it = large_returned_.begin(); it != large_returned_.end(); ++it) {
    result->returned_pages += it->length;
    result->spans++;
  }
}